

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::ExternalCommand::start
          (ExternalCommand *this,BuildSystem *system,TaskInterface ti)

{
  pointer ppBVar1;
  pointer ppBVar2;
  uintptr_t inputID;
  TaskInterface local_d8;
  string local_c8 [32];
  OptionalStorage<llbuild::buildsystem::BuildValue,_false> local_a8;
  
  local_d8.ctx = ti.ctx;
  local_d8.impl = ti.impl;
  local_a8.hasVal = false;
  llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::operator=
            (&(this->skipValue).Storage,&local_a8);
  llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::reset(&local_a8);
  llvm::SmallVectorImpl<llbuild::buildsystem::BuildKey>::clear
            (&(this->missingInputKeys).super_SmallVectorImpl<llbuild::buildsystem::BuildKey>);
  ppBVar1 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  inputID = 0;
  for (ppBVar2 = (this->super_Command).inputs.
                 super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar2 != ppBVar1;
      ppBVar2 = ppBVar2 + 1) {
    BuildKey::makeNode((BuildKey *)local_c8,&(*ppBVar2)->super_Node);
    std::__cxx11::string::string((string *)&local_a8,local_c8);
    llbuild::core::TaskInterface::request(&local_d8,(KeyType *)&local_a8,inputID);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    inputID = (uintptr_t)((int)inputID + 1);
  }
  (*(this->super_Command).super_JobDescriptor._vptr_JobDescriptor[0x18])
            (this,system,local_d8.impl,local_d8.ctx);
  return;
}

Assistant:

void ExternalCommand::start(BuildSystem& system,
                            core::TaskInterface ti) {
  // Initialize the build state.
  skipValue = llvm::None;
  missingInputKeys.clear();

  // Request all of the inputs.
  unsigned id = 0;
  for (auto it = inputs.begin(), ie = inputs.end(); it != ie; ++it, ++id) {
    ti.request(BuildKey::makeNode(*it).toData(), id);
  }

  // Delegate to the subclass in case it needs more custom inputs.
  startExternalCommand(system, ti);
}